

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

uint64_t do_ats_write(CPUARMState_conflict *env,uint64_t value,MMUAccessType access_type,
                     ARMMMUIdx mmu_idx)

{
  _Bool _Var1;
  _Bool _Var2;
  uint32_t uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int line;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  uint local_80;
  uint local_7c;
  ARMMMUFaultInfo_conflict1 fi;
  MemTxAttrs attrs;
  ARMCacheAttrs cacheattrs;
  hwaddr phys_addr;
  target_ulong page_size;
  int prot;
  
  attrs = (MemTxAttrs)0x0;
  fi.level = 0;
  fi.domain = 0;
  fi.stage2 = false;
  fi.s1ptw = false;
  fi.ea = false;
  fi._27_5_ = 0;
  fi.type = ARMFault_None;
  fi._4_4_ = 0;
  fi.s2addr = 0;
  cacheattrs = (ARMCacheAttrs)0x0;
  _Var1 = get_phys_addr_aarch64
                    (env,value,access_type,mmu_idx,&phys_addr,&attrs,&prot,&page_size,&fi,
                     &cacheattrs);
  if (_Var1) {
    uVar4 = env->features;
    uVar8 = (uint)uVar4;
    _Var2 = fi.s1ptw;
    if ((uVar8 >> 9 & 1) == 0) {
      if (env->aarch64 != 0) {
        uVar9 = env->pstate >> 2 & 3;
        goto LAB_0061b3e0;
      }
      uVar6 = env->uncached_cpsr & 0x1f;
      if (uVar6 == 0x10) {
        uVar6 = 0;
      }
      else if (uVar6 == 0x16) {
LAB_0061b520:
        uVar6 = 3;
      }
      else {
        if (uVar6 != 0x1a) {
          uVar9 = 1;
          if ((uVar4 >> 0x21 & 1) != 0) {
            if (uVar6 == 0x16) {
              uVar6 = 3;
              if ((uVar8 >> 0x1c & 1) == 0) goto LAB_0061b52d;
            }
            else if ((uVar4 & 0x10000000) == 0 && ((env->cp15).scr_el3 & 1) == 0) goto LAB_0061b520;
          }
          goto LAB_0061b3e0;
        }
        uVar6 = 2;
      }
LAB_0061b52d:
      if (fi.type != ARMFault_SyncExternalOnWalk) goto LAB_0061b538;
      if (fi.stage2 == true) {
        local_7c = 2;
        local_80 = 3;
        uVar9 = 3;
        if (uVar6 != 3) goto LAB_0061b9e6;
      }
      else {
        local_80 = 1;
        if ((uVar8 >> 9 & 1) == 0) {
          if (env->aarch64 == 0) {
            uVar9 = env->uncached_cpsr & 0x1f;
            if (uVar9 != 0x10) {
              if (uVar9 == 0x16) {
                local_80 = 3;
              }
              else if (uVar9 == 0x1a) {
                local_80 = 2;
              }
              else if ((uVar4 & 0x200000000) == 0) {
LAB_0061b954:
                local_80 = 1;
              }
              else if (uVar9 == 0x16) {
                local_80 = 3;
                if ((uVar8 >> 0x1c & 1) != 0) goto LAB_0061b954;
              }
              else {
                local_80 = 3;
                if ((uVar4 & 0x10000000) != 0 || ((env->cp15).scr_el3 & 1) != 0) goto LAB_0061b954;
              }
            }
          }
          else if ((env->pstate & 0xc) != 0) {
            local_80 = env->pstate >> 2 & 3;
          }
        }
        uVar9 = uVar6;
        if ((uVar4 & 0x200000000) != 0) {
          if (env->aarch64 == 0) {
            if ((env->uncached_cpsr & 0x1f) != 0x16) {
LAB_0061b99b:
              if (((env->cp15).scr_el3 & 1) != 0) goto LAB_0061b961;
            }
          }
          else if ((~env->pstate & 0xc) != 0) goto LAB_0061b99b;
          if (((uVar8 >> 0x1c & 1) == 0) && (local_80 == 1)) {
            local_80 = 3;
            goto LAB_0061b9bc;
          }
        }
LAB_0061b961:
        local_7c = 2;
        if (local_80 == 2) goto LAB_0061b9e6;
      }
LAB_0061b9bc:
      uVar6 = uVar9;
      _Var1 = arm_el_is_aa64(env,local_80);
      if ((!_Var1) && (_Var1 = arm_s1_regime_using_lpae_format_aarch64(env,mmu_idx), !_Var1)) {
        uVar3 = arm_fi_to_sfsc(&fi);
        uVar8 = 0x3f;
        goto LAB_0061ba02;
      }
      local_7c = local_80;
    }
    else {
      uVar9 = 1;
      if ((env->v7m).exception == 0) {
        uVar9 = ~(env->v7m).control[(env->v7m).secure] & 1;
      }
LAB_0061b3e0:
      uVar6 = uVar9;
      if ((fi.s1ptw != true) || (uVar9 != 1)) goto LAB_0061b52d;
      if ((uVar4 >> 0x21 & 1) != 0) {
        if (env->aarch64 == 0) {
          uVar6 = 1;
          if ((env->uncached_cpsr & 0x1f) != 0x16) goto LAB_0061b47f;
        }
        else {
          uVar6 = 1;
          if ((~env->pstate & 0xc) != 0) {
LAB_0061b47f:
            uVar6 = 1;
            if ((mmu_idx - ARMMMUIdx_Stage1_E0 < 3) && (((env->cp15).scr_el3 & 1) != 0))
            goto LAB_0061b49c;
          }
        }
        goto LAB_0061b52d;
      }
      uVar6 = 1;
      if (2 < mmu_idx - ARMMMUIdx_Stage1_E0) goto LAB_0061b52d;
LAB_0061b49c:
      uVar6 = 1;
      if ((fi.type == ARMFault_SyncExternalOnWalk) && (((env->cp15).scr_el3 & 8) != 0)) {
        local_80 = 3;
        uVar9 = 1;
        goto LAB_0061b9bc;
      }
      (env->cp15).hpfar_el2 = fi.s2addr >> 8 & 0x7fffffffffff0;
      local_7c = 2;
    }
LAB_0061b9e6:
    uVar3 = arm_fi_to_lfsc(&fi);
    uVar8 = uVar3 & 0x3f;
    local_80 = local_7c;
LAB_0061ba02:
    (env->exception).vaddress = value;
    (env->exception).fsr = uVar3;
    raise_exception_aarch64
              (env,4,((uint)_Var2 << 7 | uVar8) +
                     ((uint)fi.ea << 9 | (uint)(uVar6 == local_80) << 0x1a) + 0x92000140,local_80);
  }
LAB_0061b538:
  if (env->aarch64 != 0) goto LAB_0061b541;
  uVar4 = env->features;
  if (((uint)uVar4 >> 0x1a & 1) == 0) {
LAB_0061b57b:
    if (!_Var1) {
      uVar5 = (ulong)((uint)phys_addr & 0xfffff000);
      uVar7 = (ulong)((uint)phys_addr & 0xff000000) | 2;
      if ((uVar4 & 0x20) == 0) {
        uVar7 = uVar5;
      }
      if (page_size != 0x1000000) {
        uVar7 = uVar5;
      }
      if (((uint)attrs & 2) == 0) {
        return uVar7 + 0x200;
      }
      return uVar7;
    }
    uVar4 = fi._0_8_ & 0xffffffff;
    switch(uVar4) {
    case 0:
      goto switchD_0061b5a0_caseD_0;
    case 1:
      uVar8 = (uint)(fi.level != 1) * 3 + 3;
      break;
    case 2:
      uVar8 = 1;
      break;
    case 3:
      uVar8 = 0;
      break;
    case 4:
      uVar8 = (uint)(fi.level != 1) * 2 + 9;
      break;
    case 5:
      uVar8 = (uint)(fi.level != 1) * 2 + 0xd;
      break;
    case 6:
      uVar8 = (uint)(fi.level != 1) * 2 + 5;
      break;
    default:
      line = 0x2a3;
      goto LAB_0061ba81;
    case 8:
      uVar8 = (uint)fi.ea << 0xc | 8;
      break;
    case 9:
      uVar8 = (uint)fi.ea * 0x1000 + (uint)(fi.level != 1) * 2 + 0xc;
      break;
    case 10:
      uVar8 = 0x409;
      break;
    case 0xb:
      uVar8 = (uint)(fi.level != 1) * 2 + 0x40c;
      break;
    case 0xc:
      uVar8 = 0x408;
      break;
    case 0xd:
      uVar8 = (uint)fi.ea << 0xc | 0x406;
      break;
    case 0xe:
      uVar8 = 2;
      break;
    case 0xf:
      uVar8 = 0x400;
      break;
    case 0x10:
      uVar8 = 0x404;
      break;
    case 0x11:
      uVar8 = 0x405;
      break;
    case 0x12:
      uVar8 = 4;
      break;
    case 0x13:
      uVar8 = 0xf;
      break;
    case 0x14:
      uVar8 = 0xe;
    }
    uVar4 = (ulong)(fi.domain << 4 | uVar8);
switchD_0061b5a0_caseD_0:
    return (ulong)(((uint)(uVar4 >> 6) & 0x40 | (uint)(uVar4 >> 5) & 0x20) + ((uint)uVar4 & 0xf) * 2
                  + 1);
  }
  _Var2 = arm_s1_regime_using_lpae_format_aarch64(env,mmu_idx);
  uVar4 = env->features;
  if ((uVar4 >> 0x20 & 1) == 0) {
    if (!_Var2) goto LAB_0061b57b;
  }
  else if ((mmu_idx < ARMMMUIdx_E2) && ((0xd0000U >> (mmu_idx & 0x1f) & 1) != 0)) {
    if (!_Var2 && ((env->cp15).hcr_el2 & 0x1001) == 0) goto LAB_0061b57b;
  }
  else {
    if (((uint)uVar4 >> 9 & 1) == 0) {
      if (env->aarch64 == 0) {
        if ((env->uncached_cpsr & 0x1f) == 0x1a) goto LAB_0061b541;
        goto LAB_0061b886;
      }
      bVar10 = (env->pstate & 0xc) == 8;
    }
    else {
LAB_0061b886:
      bVar10 = false;
    }
    if (!_Var2 && !bVar10) goto LAB_0061b57b;
  }
LAB_0061b541:
  if (!_Var1) {
    return (ulong)((ushort)cacheattrs._0_2_ >> 1 & 0x180) |
           (ulong)(ushort)cacheattrs._0_2_ << 0x38 |
           (ulong)(((uint)attrs & 2) == 0) << 9 | phys_addr & 0xfffffffffffff000 | 0x800;
  }
  switch(fi._0_8_ & 0xffffffff) {
  case 0:
    uVar4 = 0x801;
    goto LAB_0061b73f;
  case 1:
    uVar8 = fi.level & 3U | 8;
    break;
  case 2:
    uVar8 = 0x21;
    break;
  default:
    line = 0x2e8;
LAB_0061ba81:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/internals.h"
               ,line,(char *)0x0);
  case 5:
    uVar8 = fi.level & 3U | 0xc;
    break;
  case 6:
    uVar8 = fi.level & 3U | 4;
    break;
  case 7:
    uVar8 = fi.level & 3;
    break;
  case 8:
    uVar8 = 0x10;
    break;
  case 9:
    uVar8 = fi.level & 3U | 0x14;
    break;
  case 10:
    uVar8 = 0x18;
    break;
  case 0xb:
    uVar8 = fi.level & 3U | 0x1c;
    break;
  case 0xc:
    uVar8 = 0x19;
    break;
  case 0xd:
    uVar8 = 0x11;
    break;
  case 0xe:
    uVar8 = 0x22;
    break;
  case 0xf:
    uVar8 = 0x30;
    break;
  case 0x10:
    uVar8 = 0x34;
    break;
  case 0x11:
    uVar8 = 0x35;
  }
  uVar4 = (ulong)(uVar8 * 2 + 0x801);
LAB_0061b73f:
  uVar7 = uVar4 | 0x200;
  if (fi.stage2 == false) {
    uVar7 = uVar4;
  }
  uVar4 = uVar7 | 0x100;
  if (fi.s1ptw == false) {
    uVar4 = uVar7;
  }
  return uVar4;
}

Assistant:

static uint64_t do_ats_write(CPUARMState *env, uint64_t value,
                             MMUAccessType access_type, ARMMMUIdx mmu_idx)
{
    hwaddr phys_addr;
    target_ulong page_size;
    int prot;
    bool ret;
    uint64_t par64;
    bool format64 = false;
    MemTxAttrs attrs = { 0 };
    ARMMMUFaultInfo fi = { 0 };
    ARMCacheAttrs cacheattrs = { 0 };

    ret = get_phys_addr(env, value, access_type, mmu_idx, &phys_addr, &attrs,
                        &prot, &page_size, &fi, &cacheattrs);

    if (ret) {
        /*
         * Some kinds of translation fault must cause exceptions rather
         * than being reported in the PAR.
         */
        int current_el = arm_current_el(env);
        int target_el;
        uint32_t syn, fsr, fsc;
        bool take_exc = false;

        if (fi.s1ptw && current_el == 1 && !arm_is_secure(env)
            && arm_mmu_idx_is_stage1_of_2(mmu_idx)) {
            /*
             * Synchronous stage 2 fault on an access made as part of the
             * translation table walk for AT S1E0* or AT S1E1* insn
             * executed from NS EL1. If this is a synchronous external abort
             * and SCR_EL3.EA == 1, then we take a synchronous external abort
             * to EL3. Otherwise the fault is taken as an exception to EL2,
             * and HPFAR_EL2 holds the faulting IPA.
             */
            if (fi.type == ARMFault_SyncExternalOnWalk &&
                (env->cp15.scr_el3 & SCR_EA)) {
                target_el = 3;
            } else {
                env->cp15.hpfar_el2 = extract64(fi.s2addr, 12, 47) << 4;
                target_el = 2;
            }
            take_exc = true;
        } else if (fi.type == ARMFault_SyncExternalOnWalk) {
            /*
             * Synchronous external aborts during a translation table walk
             * are taken as Data Abort exceptions.
             */
            if (fi.stage2) {
                if (current_el == 3) {
                    target_el = 3;
                } else {
                    target_el = 2;
                }
            } else {
                target_el = exception_target_el(env);
            }
            take_exc = true;
        }

        if (take_exc) {
            /* Construct FSR and FSC using same logic as arm_deliver_fault() */
            if (target_el == 2 || arm_el_is_aa64(env, target_el) ||
                arm_s1_regime_using_lpae_format(env, mmu_idx)) {
                fsr = arm_fi_to_lfsc(&fi);
                fsc = extract32(fsr, 0, 6);
            } else {
                fsr = arm_fi_to_sfsc(&fi);
                fsc = 0x3f;
            }
            /*
             * Report exception with ESR indicating a fault due to a
             * translation table walk for a cache maintenance instruction.
             */
            syn = syn_data_abort_no_iss(current_el == target_el,
                                        fi.ea, 1, fi.s1ptw, 1, fsc);
            env->exception.vaddress = value;
            env->exception.fsr = fsr;
            raise_exception(env, EXCP_DATA_ABORT, syn, target_el);
        }
    }

    if (is_a64(env)) {
        format64 = true;
    } else if (arm_feature(env, ARM_FEATURE_LPAE)) {
        /*
         * ATS1Cxx:
         * * TTBCR.EAE determines whether the result is returned using the
         *   32-bit or the 64-bit PAR format
         * * Instructions executed in Hyp mode always use the 64bit format
         *
         * ATS1S2NSOxx uses the 64bit format if any of the following is true:
         * * The Non-secure TTBCR.EAE bit is set to 1
         * * The implementation includes EL2, and the value of HCR.VM is 1
         *
         * (Note that HCR.DC makes HCR.VM behave as if it is 1.)
         *
         * ATS1Hx always uses the 64bit format.
         */
        format64 = arm_s1_regime_using_lpae_format(env, mmu_idx);

        if (arm_feature(env, ARM_FEATURE_EL2)) {
            if (mmu_idx == ARMMMUIdx_E10_0 ||
                mmu_idx == ARMMMUIdx_E10_1 ||
                mmu_idx == ARMMMUIdx_E10_1_PAN) {
                format64 |= env->cp15.hcr_el2 & (HCR_VM | HCR_DC);
            } else {
                format64 |= arm_current_el(env) == 2;
            }
        }
    }

    if (format64) {
        /* Create a 64-bit PAR */
        par64 = (1 << 11); /* LPAE bit always set */
        if (!ret) {
            par64 |= phys_addr & ~0xfffULL;
            if (!attrs.secure) {
                par64 |= (1 << 9); /* NS */
            }
            par64 |= (uint64_t)cacheattrs.attrs << 56; /* ATTR */
            par64 |= cacheattrs.shareability << 7; /* SH */
        } else {
            uint32_t fsr = arm_fi_to_lfsc(&fi);

            par64 |= 1; /* F */
            par64 |= (fsr & 0x3f) << 1; /* FS */
            if (fi.stage2) {
                par64 |= (1 << 9); /* S */
            }
            if (fi.s1ptw) {
                par64 |= (1 << 8); /* PTW */
            }
        }
    } else {
        /* fsr is a DFSR/IFSR value for the short descriptor
         * translation table format (with WnR always clear).
         * Convert it to a 32-bit PAR.
         */
        if (!ret) {
            /* We do not set any attribute bits in the PAR */
            if (page_size == (1 << 24)
                && arm_feature(env, ARM_FEATURE_V7)) {
                par64 = (phys_addr & 0xff000000) | (1 << 1);
            } else {
                par64 = phys_addr & 0xfffff000;
            }
            if (!attrs.secure) {
                par64 |= (1 << 9); /* NS */
            }
        } else {
            uint32_t fsr = arm_fi_to_sfsc(&fi);

            par64 = ((fsr & (1 << 10)) >> 5) | ((fsr & (1 << 12)) >> 6) |
                    ((fsr & 0xf) << 1) | 1;
        }
    }
    return par64;
}